

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL __thiscall Js::JavascriptArray::DirectDeleteItemAt<int>(JavascriptArray *this,uint32 itemIndex)

{
  DynamicObjectFlags DVar1;
  SparseArraySegmentBase *this_00;
  Recycler *recycler;
  Type TVar2;
  
  if (itemIndex < (this->super_ArrayObject).length) {
    this_00 = GetBeginLookupSegment(this,itemIndex,true);
    if (this_00 != (SparseArraySegmentBase *)0x0) {
      while (this_00->left <= itemIndex) {
        if (itemIndex < this_00->left + this_00->length) {
          recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
          SparseArraySegment<int>::SetElement
                    ((SparseArraySegment<int> *)this_00,recycler,itemIndex,-0x7fffe);
          TVar2 = itemIndex - this_00->left;
          if (TVar2 == this_00->length - 1) {
            this_00->length = TVar2;
            SparseArraySegmentBase::CheckLengthvsSize(this_00);
          }
          else if (this_00 == (this->head).ptr) {
            DVar1 = DynamicObject::GetArrayFlags((DynamicObject *)this);
            DynamicObject::SetArrayFlags((DynamicObject *)this,DVar1 & ~HasNoMissingValues);
          }
          break;
        }
        this_00 = (this_00->next).ptr;
        if (this_00 == (SparseArraySegmentBase *)0x0) break;
      }
    }
    (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(this);
  }
  return 1;
}

Assistant:

BOOL JavascriptArray::DirectDeleteItemAt(uint32 itemIndex)
    {
        if (itemIndex >= length)
        {
            return true;
        }
        SparseArraySegment<T>* next = (SparseArraySegment<T>*)GetBeginLookupSegment(itemIndex);
        while(next != nullptr && next->left <= itemIndex)
        {
            uint32 limit = next->left + next->length;
            if (itemIndex < limit)
            {
                next->SetElement(GetRecycler(), itemIndex, SparseArraySegment<T>::GetMissingItem());
                if(itemIndex - next->left == next->length - 1)
                {
                    --next->length;
                    next->CheckLengthvsSize();
                }
                else if(next == head)
                {
                    SetHasNoMissingValues(false);
                }
                break;
            }
            next = SparseArraySegment<T>::From(next->next);
        }
#ifdef VALIDATE_ARRAY
        ValidateArray();
#endif
        return true;
    }